

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_cconv.c
# Opt level: O0

int lj_cconv_tv_bf(CTState *cts,CType *s,TValue *o,uint8_t *sp)

{
  byte bVar1;
  uint uVar2;
  uint uVar3;
  byte bVar4;
  uint *in_RCX;
  double *in_RDX;
  uint *in_RSI;
  long in_RDI;
  uint32_t b;
  CTSize shift;
  uint32_t val;
  CTSize bsz;
  CTSize pos;
  CTInfo info;
  ErrMsg in_stack_ffffffffffffff9c;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  uint local_40;
  
  uVar3 = *in_RSI;
  uVar2 = uVar3 >> 0x10 & 0x7f;
  if (uVar2 == 1) {
    local_40 = (uint)(byte)*in_RCX;
  }
  else if (uVar2 == 2) {
    local_40 = (uint)(ushort)*in_RCX;
  }
  else if (uVar2 == 4) {
    local_40 = *in_RCX;
  }
  else {
    local_40 = 0;
  }
  uVar2 = uVar3 >> 8 & 0x7f;
  if ((uVar3 & 0x7f) + uVar2 <= (uVar3 >> 0x10 & 0x7f) << 3) {
    bVar4 = (byte)(uVar3 & 0x7f);
    if ((uVar3 & 0x8000000) == 0) {
      bVar1 = 0x20 - (char)uVar2;
      if ((uVar3 & 0x800000) == 0) {
        *in_RDX = (double)((int)(local_40 << (bVar1 - bVar4 & 0x1f)) >> (bVar1 & 0x1f));
      }
      else {
        *in_RDX = (double)((local_40 << (bVar1 - bVar4 & 0x1f)) >> (bVar1 & 0x1f));
      }
    }
    else {
      uVar3 = local_40 >> (bVar4 & 0x1f) & 1;
      *(uint *)((long)in_RDX + 4) = -2 - uVar3;
      *(uint *)(*(long *)(in_RDI + 0x18) + 0x124) = -2 - uVar3;
    }
    return 0;
  }
  lj_err_caller((lua_State *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                in_stack_ffffffffffffff9c);
}

Assistant:

int lj_cconv_tv_bf(CTState *cts, CType *s, TValue *o, uint8_t *sp)
{
  CTInfo info = s->info;
  CTSize pos, bsz;
  uint32_t val;
  lj_assertCTS(ctype_isbitfield(info), "bitfield expected");
  /* NYI: packed bitfields may cause misaligned reads. */
  switch (ctype_bitcsz(info)) {
  case 4: val = *(uint32_t *)sp; break;
  case 2: val = *(uint16_t *)sp; break;
  case 1: val = *(uint8_t *)sp; break;
  default:
    lj_assertCTS(0, "bad bitfield container size %d", ctype_bitcsz(info));
    val = 0;
    break;
  }
  /* Check if a packed bitfield crosses a container boundary. */
  pos = ctype_bitpos(info);
  bsz = ctype_bitbsz(info);
  lj_assertCTS(pos < 8*ctype_bitcsz(info), "bad bitfield position");
  lj_assertCTS(bsz > 0 && bsz <= 8*ctype_bitcsz(info), "bad bitfield size");
  if (pos + bsz > 8*ctype_bitcsz(info))
    lj_err_caller(cts->L, LJ_ERR_FFI_NYIPACKBIT);
  if (!(info & CTF_BOOL)) {
    CTSize shift = 32 - bsz;
    if (!(info & CTF_UNSIGNED)) {
      setintV(o, (int32_t)(val << (shift-pos)) >> shift);
    } else {
      val = (val << (shift-pos)) >> shift;
      if (!LJ_DUALNUM || (int32_t)val < 0)
	setnumV(o, (lua_Number)(uint32_t)val);
      else
	setintV(o, (int32_t)val);
    }
  } else {
    uint32_t b = (val >> pos) & 1;
    lj_assertCTS(bsz == 1, "bad bool bitfield size");
    setboolV(o, b);
    setboolV(&cts->g->tmptv2, b);  /* Remember for trace recorder. */
  }
  return 0;  /* No GC step needed. */
}